

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O2

void __thiscall QMakeProperty::reload(QMakeProperty *this)

{
  ProString *pPVar1;
  QHash<ProKey,_ProString> *this_00;
  long lVar2;
  int loc;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QStringBuilder<QString_&,_const_char_(&)[5]> local_110;
  QArrayDataPointer<char16_t> local_100;
  ProString local_e8;
  QArrayDataPointer<char16_t> local_b8;
  ProString local_98;
  QByteArrayView local_68;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QMakeLibraryInfo::reload();
  this_00 = &this->m_values;
  for (lVar2 = 0; lVar2 != 0x170; lVar2 = lVar2 + 0x10) {
    local_58.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              (&local_68,(char **)((long)&propList[0].name + lVar2));
    QVar3.m_data = (storage_type *)local_68.m_size;
    QVar3.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar3);
    if ((&propList[0].singular)[lVar2] == true) {
      loc = *(int *)((long)&propList[0].loc + lVar2);
    }
    else {
      loc = *(int *)((long)&propList[0].loc + lVar2);
      QMakeLibraryInfo::rawLocation((QString *)&local_b8,loc,EffectiveSourcePaths);
      ProString::ProString(&local_98,(QString *)&local_b8);
      local_100.ptr = L"/src";
      local_100.d = (Data *)&local_58;
      ProString::ProString<QString&,char_const(&)[5]>
                (&local_e8,(QStringBuilder<QString_&,_const_char_(&)[5]> *)&local_100);
      pPVar1 = QHash<ProKey,_ProString>::operator[](this_00,(ProKey *)&local_e8);
      ProString::operator=(pPVar1,&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QMakeLibraryInfo::rawLocation((QString *)&local_b8,loc,EffectivePaths);
      ProString::ProString(&local_98,(QString *)&local_b8);
      local_100.ptr = L"/get";
      local_100.d = (Data *)&local_58;
      ProString::ProString<QString&,char_const(&)[5]>
                (&local_e8,(QStringBuilder<QString_&,_const_char_(&)[5]> *)&local_100);
      pPVar1 = QHash<ProKey,_ProString>::operator[](this_00,(ProKey *)&local_e8);
      ProString::operator=(pPVar1,&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    }
    local_b8.size = -0x5555555555555556;
    local_b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_b8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QMakeLibraryInfo::rawLocation((QString *)&local_b8,loc,FinalPaths);
    if ((&propList[0].raw)[lVar2] == false) {
      QMakeLibraryInfo::rawLocation((QString *)&local_100,loc,DevicePaths);
      ProString::ProString(&local_98,(QString *)&local_100);
      local_110.a = (QString *)&local_58;
      local_110.b = (char (*) [5])0x227810;
      ProString::ProString<QString&,char_const(&)[5]>(&local_e8,&local_110);
      pPVar1 = QHash<ProKey,_ProString>::operator[](this_00,(ProKey *)&local_e8);
      ProString::operator=(pPVar1,&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
      QMakeLibraryInfo::path((QString *)&local_100,loc);
      ProString::ProString(&local_98,(QString *)&local_100);
      ProKey::ProKey((ProKey *)&local_e8,(QString *)&local_58);
      pPVar1 = QHash<ProKey,_ProString>::operator[](this_00,(ProKey *)&local_e8);
      ProString::operator=(pPVar1,&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
      QString::operator+=((QString *)&local_58,"/raw");
    }
    ProString::ProString(&local_98,(QString *)&local_b8);
    ProKey::ProKey((ProKey *)&local_e8,(QString *)&local_58);
    pPVar1 = QHash<ProKey,_ProString>::operator[](this_00,(ProKey *)&local_e8);
    ProString::operator=(pPVar1,&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  ProString::ProString(&local_98,"3.1");
  ProKey::ProKey((ProKey *)&local_e8,"QMAKE_VERSION");
  pPVar1 = QHash<ProKey,_ProString>::operator[](this_00,(ProKey *)&local_e8);
  ProString::operator=(pPVar1,&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  ProString::ProString(&local_98,"6.10.0");
  ProKey::ProKey((ProKey *)&local_e8,"QT_VERSION");
  pPVar1 = QHash<ProKey,_ProString>::operator[](this_00,(ProKey *)&local_e8);
  ProString::operator=(pPVar1,&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeProperty::reload()
{
    QMakeLibraryInfo::reload();
    for (unsigned i = 0; i < sizeof(propList)/sizeof(propList[0]); i++) {
        QString name = QString::fromLatin1(propList[i].name);
        if (!propList[i].singular) {
            m_values[ProKey(name + "/src")] = QMakeLibraryInfo::rawLocation(
                    propList[i].loc, QMakeLibraryInfo::EffectiveSourcePaths);
            m_values[ProKey(name + "/get")] = QMakeLibraryInfo::rawLocation(
                    propList[i].loc, QMakeLibraryInfo::EffectivePaths);
        }
        QString val = QMakeLibraryInfo::rawLocation(propList[i].loc, QMakeLibraryInfo::FinalPaths);
        if (!propList[i].raw) {
            m_values[ProKey(name + "/dev")] =
                    QMakeLibraryInfo::rawLocation(propList[i].loc, QMakeLibraryInfo::DevicePaths);
            m_values[ProKey(name)] = QMakeLibraryInfo::path(propList[i].loc);
            name += "/raw";
        }
        m_values[ProKey(name)] = val;
    }
#ifdef QMAKE_VERSION_STR
    m_values["QMAKE_VERSION"] = ProString(QMAKE_VERSION_STR);
#endif
#ifdef QT_VERSION_STR
    m_values["QT_VERSION"] = ProString(QT_VERSION_STR);
#endif
}